

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O1

void PlayOrganObject(uchar key,int mode,char track,long freq)

{
  byte bVar1;
  uchar uVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  
  if (audio_backend_initialised) {
    uVar5 = key / 0xc;
    uVar4 = (ulong)key_twin[track];
    if (*(long *)((long)lpORGANBUFFER[track][0] + uVar4 * 8 + (ulong)(uVar5 << 4)) != 0) {
      if (mode == -1) {
        bVar1 = old_key[track];
        if (bVar1 == 0xff) {
          ChangeOrganFrequency(key + (key / 3 & 0xfc) * -3,track,freq);
          AudioBackend_PlaySound
                    (*(AudioBackend_Sound **)
                      ((long)lpORGANBUFFER[track][0] +
                      (ulong)key_twin[track] * 8 + (ulong)(uVar5 << 4)),true);
          old_key[track] = key;
          key_on[track] = '\x01';
        }
        else {
          uVar2 = key_on[track];
          AudioBackend_PlaySound
                    (*(AudioBackend_Sound **)
                      ((long)lpORGANBUFFER[track][0] +
                      uVar4 * 8 + (ulong)((uint)bVar1 * 0xab >> 7 & 0xfffffff0)),false);
          bVar3 = key_twin[track] + 1;
          if (1 < bVar3) {
            bVar3 = 0;
          }
          key_twin[track] = bVar3;
          if ((bVar1 == key) && (uVar2 == '\x01')) {
            AudioBackend_PlaySound
                      (*(AudioBackend_Sound **)
                        ((long)lpORGANBUFFER[track][0] + (ulong)bVar3 * 8 + (ulong)(uVar5 << 4)),
                       true);
            return;
          }
          ChangeOrganFrequency(key + (char)(uVar5 << 2) * -3,track,freq);
          AudioBackend_PlaySound
                    (*(AudioBackend_Sound **)
                      ((long)lpORGANBUFFER[track][0] +
                      (ulong)key_twin[track] * 8 + (ulong)(uVar5 << 4)),true);
          old_key[track] = key;
        }
      }
      else if (mode == 2) {
        if (old_key[track] != 0xff) {
          AudioBackend_PlaySound
                    (*(AudioBackend_Sound **)
                      ((long)lpORGANBUFFER[track][0] +
                      uVar4 * 8 + (ulong)((uint)old_key[track] * 0xab >> 7 & 0xfffffff0)),false);
          old_key[track] = 0xff;
        }
      }
      else if ((mode == 0) && (old_key[track] != 0xff)) {
        AudioBackend_StopSound
                  (*(AudioBackend_Sound **)
                    ((long)lpORGANBUFFER[track][0] +
                    uVar4 * 8 + (ulong)((uint)old_key[track] * 0xab >> 7 & 0xfffffff0)));
        AudioBackend_RewindSound
                  (*(AudioBackend_Sound **)
                    ((long)lpORGANBUFFER[track][0] +
                    (ulong)key_twin[track] * 8 +
                    (ulong)((uint)old_key[track] * 0xab >> 7 & 0xfffffff0)));
        return;
      }
    }
  }
  return;
}

Assistant:

void PlayOrganObject(unsigned char key, int mode, signed char track, long freq)
{
	if (!audio_backend_initialised)
		return;

	if (lpORGANBUFFER[track][key / 12][key_twin[track]] != NULL)
	{
		switch (mode)
		{
			case 0:	// 停止 (Stop)
				if (old_key[track] != 0xFF)
				{
					AudioBackend_StopSound(lpORGANBUFFER[track][old_key[track] / 12][key_twin[track]]);
					AudioBackend_RewindSound(lpORGANBUFFER[track][old_key[track] / 12][key_twin[track]]);
				}
				break;

			case 1: // 再生 (Playback)
				break;

			case 2:	// 歩かせ停止 (Stop playback)
				if (old_key[track] != 0xFF)
				{
					AudioBackend_PlaySound(lpORGANBUFFER[track][old_key[track] / 12][key_twin[track]], FALSE);
					old_key[track] = 0xFF;
				}
				break;

			case -1:
				if (old_key[track] == 0xFF)	// 新規鳴らす (New sound)
				{
					ChangeOrganFrequency(key % 12, track, freq);	// 周波数を設定して (Set the frequency)
					AudioBackend_PlaySound(lpORGANBUFFER[track][key / 12][key_twin[track]], TRUE);
					old_key[track] = key;
					key_on[track] = 1;
				}
				else if (key_on[track] == 1 && old_key[track] == key)	// 同じ音 (Same sound)
				{
					// 今なっているのを歩かせ停止 (Stop playback now)
					AudioBackend_PlaySound(lpORGANBUFFER[track][old_key[track] / 12][key_twin[track]], FALSE);
					key_twin[track]++;
					if (key_twin[track] > 1)
						key_twin[track] = 0;
					AudioBackend_PlaySound(lpORGANBUFFER[track][key / 12][key_twin[track]], TRUE);
				}
				else	// 違う音を鳴らすなら (If you make a different sound)
				{
					AudioBackend_PlaySound(lpORGANBUFFER[track][old_key[track] / 12][key_twin[track]], FALSE);	// 今なっているのを歩かせ停止 (Stop playback now)
					key_twin[track]++;
					if (key_twin[track] > 1)
						key_twin[track] = 0;
					ChangeOrganFrequency(key % 12, track, freq);	// 周波数を設定して (Set the frequency)
					AudioBackend_PlaySound(lpORGANBUFFER[track][key / 12][key_twin[track]], TRUE);
					old_key[track] = key;
				}

				break;
		}
	}
}